

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

size_t wwNAF(word *naf,word *a,size_t n,size_t w)

{
  bool_t bVar1;
  word *pwVar2;
  word *pwVar3;
  word *pwVar4;
  word *a_00;
  word *in_RCX;
  size_t in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t i;
  size_t a_len;
  size_t naf_size;
  size_t naf_len;
  word digit;
  word window;
  word mask;
  word hi_bit;
  word next_bit;
  size_t in_stack_ffffffffffffff78;
  word *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  bool bVar5;
  size_t local_60;
  word *local_50;
  word *local_48;
  size_t local_8;
  
  pwVar2 = (word *)(1L << ((byte)in_RCX & 0x3f));
  pwVar3 = (word *)((ulong)pwVar2 >> 1);
  local_60 = 0;
  pwVar4 = (word *)wwBitSize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  wwSetZero(in_RDI,in_RDX * 2 + 1);
  bVar1 = wwIsZero(in_RSI,in_RDX);
  if (bVar1 == 0) {
    local_48 = (word *)wwGetBits(in_RSI,0,(size_t)in_RCX);
    for (a_00 = in_RCX; bVar5 = local_48 != (word *)0x0 || a_00 < pwVar4,
        local_48 != (word *)0x0 || a_00 < pwVar4; a_00 = (word *)((long)a_00 + 1)) {
      if (((ulong)local_48 & 1) == 0) {
        wwShHi(a_00,CONCAT17(bVar5,in_stack_ffffffffffffff88),(size_t)in_stack_ffffffffffffff80);
      }
      else {
        if (((ulong)local_48 & (ulong)pwVar3) == 0) {
          local_50 = local_48;
          local_48 = (word *)0x0;
        }
        else if (a_00 < pwVar4) {
          local_50 = (word *)((ulong)pwVar3 ^ -(long)local_48 & (long)pwVar3 - 1U);
          local_48 = pwVar2;
        }
        else {
          local_50 = (word *)((ulong)local_48 & (long)pwVar3 - 1U);
          local_48 = pwVar3;
        }
        wwShHi(a_00,CONCAT17(bVar5,in_stack_ffffffffffffff88),(size_t)in_stack_ffffffffffffff80);
        wwSetBits(in_RDI,0,(size_t)in_RCX,(word)local_50);
      }
      local_60 = local_60 + 1;
      local_48 = (word *)((ulong)local_48 >> 1);
      if (a_00 < pwVar4) {
        in_stack_ffffffffffffff80 = pwVar3;
        bVar1 = wwTestBit(in_RSI,(size_t)a_00);
        local_48 = (word *)((long)in_stack_ffffffffffffff80 * (long)bVar1 + (long)local_48);
      }
    }
    local_8 = local_60;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t wwNAF(word naf[], const word a[], size_t n, size_t w)
{
	const word next_bit = WORD_BIT_POS(w);
	const word hi_bit = next_bit >> 1;
	const word mask = hi_bit - 1;
	register word window;
	register word digit;
	register size_t naf_len = 0;
	register size_t naf_size = 0;
	register size_t a_len = wwBitSize(a, n);
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, n, naf, 2 * n + 1));
	ASSERT(2 <= w && w < B_PER_W);
	// naf <- 0
	wwSetZero(naf, 2 * n + 1);
	// a == 0?
	if (wwIsZero(a, n))
		return 0;
	// window <- a mod 2^w
	window = wwGetBits(a, 0, w);
	// расчет NAF
	for (i = w; window || i < a_len; ++i)
	{
		// ненулевой символ?
		if (window & 1)
		{
			// кодирование отрицательного символа
			if (window & hi_bit)
			{
				// модифицировать отрицательный символ суффикса NAF...
				if (i >= a_len)
					// ...сделать его положительным
					digit = window & mask,
					// window <- window - digit
					window = hi_bit;
				else
					// digit <- |window|
					digit = (0 - window) & mask,
					// digit <- 1||digit
					digit ^= hi_bit,
					// window <- window - digit
					window = next_bit;
			}
			else
				// кодирование положительного символа
				digit = window,
				// window <- window - digit
				window = 0;
			// запись ненулевого символа
			wwShHi(naf, W_OF_B(naf_len + w), w);
			wwSetBits(naf, 0, w, digit);
			naf_len += w;
		}
		else
			// кодирование нулевого символа
			wwShHi(naf, W_OF_B(++naf_len), 1);
		// увеличить размер naf
		++naf_size;
		// сдвиг окна
		window >>= 1;
		if (i < a_len)
			window += hi_bit * wwTestBit(a, i);
	}
	digit = window = 0;
	naf_len = a_len = 0;
	return naf_size;
}